

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O3

void bdf_free_font(bdf_font_t *font)

{
  FT_Memory memory;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bdf_glyph_t *pbVar4;
  anon_union_8_3_ccdffb78_for_value *paVar5;
  bdf_property_t *P;
  
  if (font != (bdf_font_t *)0x0) {
    memory = font->memory;
    ft_mem_free(memory,font->name);
    font->name = (char *)0x0;
    if ((FT_Hash)font->internal != (FT_Hash)0x0) {
      ft_hash_str_free((FT_Hash)font->internal,memory);
      ft_mem_free(memory,font->internal);
      font->internal = (void *)0x0;
    }
    ft_mem_free(memory,font->comments);
    font->comments = (char *)0x0;
    uVar2 = font->props_size;
    if (uVar2 != 0) {
      lVar3 = 0x10;
      uVar1 = 0;
      do {
        if (*(int *)((long)font->props + lVar3 + -8) == 1) {
          ft_mem_free(memory,*(void **)((long)&font->props->name + lVar3));
          *(undefined8 *)((long)&font->props->name + lVar3) = 0;
          uVar2 = font->props_size;
        }
        uVar1 = uVar1 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar1 < uVar2);
    }
    ft_mem_free(memory,font->props);
    font->props = (bdf_property_t *)0x0;
    if (font->glyphs_used != 0) {
      pbVar4 = font->glyphs;
      uVar2 = 0;
      do {
        ft_mem_free(memory,pbVar4->name);
        pbVar4->name = (char *)0x0;
        ft_mem_free(memory,pbVar4->bitmap);
        pbVar4->bitmap = (uchar *)0x0;
        uVar2 = uVar2 + 1;
        pbVar4 = pbVar4 + 1;
      } while (uVar2 < font->glyphs_used);
    }
    if (font->unencoded_used != 0) {
      pbVar4 = font->unencoded;
      uVar2 = 0;
      do {
        ft_mem_free(memory,pbVar4->name);
        pbVar4->name = (char *)0x0;
        ft_mem_free(memory,pbVar4->bitmap);
        pbVar4->bitmap = (uchar *)0x0;
        uVar2 = uVar2 + 1;
        pbVar4 = pbVar4 + 1;
      } while (uVar2 < font->unencoded_used);
    }
    ft_mem_free(memory,font->glyphs);
    font->glyphs = (bdf_glyph_t *)0x0;
    ft_mem_free(memory,font->unencoded);
    font->unencoded = (bdf_glyph_t *)0x0;
    pbVar4 = (font->overflow).glyphs;
    if ((font->overflow).glyphs_used != 0) {
      uVar2 = 0;
      do {
        ft_mem_free(memory,pbVar4->name);
        pbVar4->name = (char *)0x0;
        ft_mem_free(memory,pbVar4->bitmap);
        pbVar4->bitmap = (uchar *)0x0;
        uVar2 = uVar2 + 1;
        pbVar4 = pbVar4 + 1;
      } while (uVar2 < (font->overflow).glyphs_used);
      pbVar4 = (font->overflow).glyphs;
    }
    ft_mem_free(memory,pbVar4);
    (font->overflow).glyphs = (bdf_glyph_t *)0x0;
    ft_hash_str_free(&font->proptbl,memory);
    P = font->user_props;
    if (font->nuser_props != 0) {
      paVar5 = &P->value;
      uVar2 = 0;
      do {
        ft_mem_free(memory,((bdf_property_t *)(paVar5 + -2))->name);
        ((bdf_property_t *)(paVar5 + -2))->name = (char *)0x0;
        if (*(int *)(paVar5 + -1) == 1) {
          ft_mem_free(memory,paVar5->atom);
          paVar5->atom = (char *)0x0;
        }
        uVar2 = uVar2 + 1;
        paVar5 = paVar5 + 3;
      } while (uVar2 < font->nuser_props);
      P = font->user_props;
    }
    ft_mem_free(memory,P);
    font->user_props = (bdf_property_t *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  bdf_free_font( bdf_font_t*  font )
  {
    bdf_property_t*  prop;
    unsigned long    i;
    bdf_glyph_t*     glyphs;
    FT_Memory        memory;


    if ( font == 0 )
      return;

    memory = font->memory;

    FT_FREE( font->name );

    /* Free up the internal hash table of property names. */
    if ( font->internal )
    {
      ft_hash_str_free( (FT_Hash)font->internal, memory );
      FT_FREE( font->internal );
    }

    /* Free up the comment info. */
    FT_FREE( font->comments );

    /* Free up the properties. */
    for ( i = 0; i < font->props_size; i++ )
    {
      if ( font->props[i].format == BDF_ATOM )
        FT_FREE( font->props[i].value.atom );
    }

    FT_FREE( font->props );

    /* Free up the character info. */
    for ( i = 0, glyphs = font->glyphs;
          i < font->glyphs_used; i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    for ( i = 0, glyphs = font->unencoded; i < font->unencoded_used;
          i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    FT_FREE( font->glyphs );
    FT_FREE( font->unencoded );

    /* Free up the overflow storage if it was used. */
    for ( i = 0, glyphs = font->overflow.glyphs;
          i < font->overflow.glyphs_used; i++, glyphs++ )
    {
      FT_FREE( glyphs->name );
      FT_FREE( glyphs->bitmap );
    }

    FT_FREE( font->overflow.glyphs );

    /* bdf_cleanup */
    ft_hash_str_free( &(font->proptbl), memory );

    /* Free up the user defined properties. */
    for ( prop = font->user_props, i = 0;
          i < font->nuser_props; i++, prop++ )
    {
      FT_FREE( prop->name );
      if ( prop->format == BDF_ATOM )
        FT_FREE( prop->value.atom );
    }

    FT_FREE( font->user_props );

    /* FREE( font ); */ /* XXX Fixme */
  }